

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O2

SinkFinalizeType __thiscall
duckdb::PhysicalIEJoin::Finalize
          (PhysicalIEJoin *this,Pipeline *pipeline,Event *event,ClientContext *context,
          OperatorSinkFinalizeInput *input)

{
  long *plVar1;
  GlobalSinkState *pGVar2;
  bool bVar3;
  SinkFinalizeType SVar4;
  reference this_00;
  type this_01;
  long lVar5;
  byte bVar6;
  
  pGVar2 = input->global_state;
  this_00 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
            ::get<true>((vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
                         *)(pGVar2 + 1),
                        *(size_type *)
                         ((long)&pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base.
                                 _M_mutex + 8));
  this_01 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
            ::operator*(this_00);
  lVar5 = *(long *)((long)&pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex
                   + 8);
  if (lVar5 == 1) {
    bVar3 = PropagatesBuildSide((this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                                super_PhysicalJoin.super_CachingPhysicalOperator.field_0x81);
    if (!bVar3) {
      lVar5 = *(long *)((long)&pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base.
                               _M_mutex + 8);
      goto LAB_018e37d3;
    }
  }
  else {
LAB_018e37d3:
    if (lVar5 != 0) goto LAB_018e37f2;
    bVar3 = IsLeftOuterJoin((this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                            super_PhysicalJoin.super_CachingPhysicalOperator.field_0x81);
    if (!bVar3) goto LAB_018e37f2;
  }
  PhysicalRangeJoin::GlobalSortedTable::IntializeMatches(this_01);
LAB_018e37f2:
  if ((((*(long *)((long)&pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex +
                  8) != 1) ||
       ((this_01->global_sort_state).sorted_blocks.
        super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this_01->global_sort_state).sorted_blocks.
        super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) ||
      (bVar6 = (this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.super_PhysicalJoin.
               super_CachingPhysicalOperator.field_0x81 - 2, 8 < bVar6)) ||
     (SVar4 = NO_OUTPUT_POSSIBLE, (0x18bU >> (bVar6 & 0x1f) & 1) == 0)) {
    PhysicalRangeJoin::GlobalSortedTable::Finalize(this_01,pipeline,event);
    plVar1 = (long *)((long)&pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base.
                             _M_mutex + 8);
    *plVar1 = *plVar1 + 1;
    SVar4 = READY;
  }
  return SVar4;
}

Assistant:

SinkFinalizeType PhysicalIEJoin::Finalize(Pipeline &pipeline, Event &event, ClientContext &context,
                                          OperatorSinkFinalizeInput &input) const {
	auto &gstate = input.global_state.Cast<IEJoinGlobalState>();
	auto &table = *gstate.tables[gstate.child];
	auto &global_sort_state = table.global_sort_state;

	if ((gstate.child == 1 && PropagatesBuildSide(join_type)) || (gstate.child == 0 && IsLeftOuterJoin(join_type))) {
		// for FULL/LEFT/RIGHT OUTER JOIN, initialize found_match to false for every tuple
		table.IntializeMatches();
	}
	if (gstate.child == 1 && global_sort_state.sorted_blocks.empty() && EmptyResultIfRHSIsEmpty()) {
		// Empty input!
		return SinkFinalizeType::NO_OUTPUT_POSSIBLE;
	}

	// Sort the current input child
	table.Finalize(pipeline, event);

	// Move to the next input child
	++gstate.child;

	return SinkFinalizeType::READY;
}